

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * whereOrName(sqlite3 *db,char *zWhere,char *zConstant)

{
  char *local_28;
  char *zNew;
  char *zConstant_local;
  char *zWhere_local;
  sqlite3 *db_local;
  
  if (zWhere == (char *)0x0) {
    local_28 = sqlite3MPrintf(db,"name=%Q",zConstant);
  }
  else {
    local_28 = sqlite3MPrintf(db,"%s OR name=%Q",zWhere,zConstant);
    sqlite3DbFree(db,zWhere);
  }
  return local_28;
}

Assistant:

static char *whereOrName(sqlite3 *db, char *zWhere, char *zConstant){
  char *zNew;
  if( !zWhere ){
    zNew = sqlite3MPrintf(db, "name=%Q", zConstant);
  }else{
    zNew = sqlite3MPrintf(db, "%s OR name=%Q", zWhere, zConstant);
    sqlite3DbFree(db, zWhere);
  }
  return zNew;
}